

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O2

bool __thiscall
cmUuid::StringToBinary
          (cmUuid *this,string *input,vector<unsigned_char,_std::allocator<unsigned_char>_> *output)

{
  int iVar1;
  pointer puVar2;
  bool bVar3;
  array<int,_5UL> *paVar4;
  long lVar5;
  long lVar6;
  string local_50;
  
  puVar2 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(output,0x10);
  if (input->_M_string_length != 0x24) {
    return false;
  }
  paVar4 = &kUuidGroups;
  lVar6 = 0;
  lVar5 = 0;
  do {
    if (lVar6 != 0) {
      if (lVar6 == 5) {
        return true;
      }
      if ((input->_M_dataplus)._M_p[lVar5] != '-') {
        return false;
      }
      lVar5 = lVar5 + 1;
    }
    iVar1 = paVar4->_M_elems[0];
    std::__cxx11::string::substr((ulong)&local_50,(ulong)input);
    bVar3 = StringToBinaryImpl(this,&local_50,output);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar3) {
      return false;
    }
    lVar5 = lVar5 + (long)iVar1 * 2;
    lVar6 = lVar6 + 1;
    paVar4 = (array<int,_5UL> *)((long)paVar4 + 4);
  } while( true );
}

Assistant:

bool cmUuid::StringToBinary(std::string const& input,
                            std::vector<unsigned char>& output) const
{
  output.clear();
  output.reserve(16);

  if (input.length() != 36) {
    return false;
  }
  size_t index = 0;
  for (size_t i = 0; i < kUuidGroups.size(); ++i) {
    if (i != 0 && input[index++] != '-') {
      return false;
    }
    size_t digits = kUuidGroups[i] * 2;
    if (!this->StringToBinaryImpl(input.substr(index, digits), output)) {
      return false;
    }

    index += digits;
  }

  return true;
}